

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

u16 __thiscall irr::scene::CXMeshFileLoader::readBinWord(CXMeshFileLoader *this)

{
  u16 uVar1;
  u16 *puVar2;
  
  puVar2 = *(u16 **)&(this->super_IMeshLoader).field_0x18;
  if (puVar2 < this->End) {
    uVar1 = *puVar2;
    *(u16 **)&(this->super_IMeshLoader).field_0x18 = puVar2 + 1;
    return uVar1;
  }
  return 0;
}

Assistant:

u16 CXMeshFileLoader::readBinWord()
{
	if (P >= End)
		return 0;
#ifdef __BIG_ENDIAN__
	const u16 tmp = os::Byteswap::byteswap(*(u16 *)P);
#else
	const u16 tmp = *(u16 *)P;
#endif
	P += 2;
	return tmp;
}